

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

WitnessSize __thiscall miniscript::Node<CPubKey>::CalcWitnessSize(Node<CPubKey> *this)

{
  uint uVar1;
  long lVar2;
  WitnessSize WVar3;
  bool bVar4;
  element_type *peVar5;
  size_type sVar6;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  size_t j;
  shared_ptr<const_miniscript::Node<CPubKey>_> *sub;
  vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  *__range4;
  uint32_t pubkey_size;
  uint32_t sig_size;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  next_sats;
  iterator __end0;
  iterator __begin0;
  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
  sats;
  MaxInt<unsigned_int> dsat_1;
  MaxInt<unsigned_int> sat_1;
  MaxInt<unsigned_int> dsat;
  MaxInt<unsigned_int> sat;
  MiniscriptContext in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  MaxInt<unsigned_int> in_stack_fffffffffffffc40;
  MaxInt<unsigned_int> in_stack_fffffffffffffc48;
  MaxInt<unsigned_int> in_stack_fffffffffffffc78;
  ulong local_298;
  MaxInt<unsigned_int> local_18;
  MaxInt<unsigned_int> local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  IsTapscript(in_stack_fffffffffffffc38);
  IsTapscript(in_stack_fffffffffffffc38);
  switch(*in_RDI) {
  case 0:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 1:
  case 4:
  case 5:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 2:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 3:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0x10:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    peVar5 = std::
             __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    local_18 = (peVar5->ws).sat;
    local_10 = (peVar5->ws).dsat;
    break;
  case 0xd:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0xe:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0xf:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x11:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x12:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x13:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::operator|
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x14:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::operator|
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x15:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::operator|
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x16:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::operator|
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::operator|
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x17:
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::operator|
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::operator[]((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::operator+
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
               (MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
              );
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x18:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    Vector<miniscript::internal::MaxInt<unsigned_int>>
              ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc78);
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::begin((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             *)in_stack_fffffffffffffc40);
    std::
    vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
    ::end((vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           *)in_stack_fffffffffffffc40);
    while (bVar4 = __gnu_cxx::
                   operator==<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                             ((__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                               *)in_stack_fffffffffffffc48,
                              (__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                               *)in_stack_fffffffffffffc40), ((bVar4 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      miniscript::internal::operator+
                ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
                 (MaxInt<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      Vector<miniscript::internal::MaxInt<unsigned_int>>
                ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc78);
      for (local_298 = 1;
          sVar6 = std::
                  vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                  ::size((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)),
          local_298 < sVar6; local_298 = local_298 + 1) {
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        miniscript::internal::operator+
                  ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
                   (MaxInt<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                      *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        miniscript::internal::operator+
                  ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
                   (MaxInt<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        miniscript::internal::operator|
                  ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
                   (MaxInt<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        std::
        vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
        ::push_back((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                    (value_type *)0x7ccd7d);
      }
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::size((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
              *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      in_stack_fffffffffffffc78 =
           miniscript::internal::operator+
                     ((MaxInt<unsigned_int> *)in_stack_fffffffffffffc40,
                      (MaxInt<unsigned_int> *)
                      CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::push_back((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                  (value_type *)0x7cce4f);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::operator=((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)in_stack_fffffffffffffc48,
                  (vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                   *)in_stack_fffffffffffffc40);
      std::
      vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
      ::~vector((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                 *)in_stack_fffffffffffffc48);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    }
    uVar1 = in_RDI[1];
    sVar6 = std::
            vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
            ::size((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    if (sVar6 < uVar1) {
      __assert_fail("k <= sats.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                    ,0x483,
                    "internal::WitnessSize miniscript::Node<CPubKey>::CalcWitnessSize() const [Key = CPubKey]"
                   );
    }
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::operator[]((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
                  *)in_stack_fffffffffffffc48,(size_type)in_stack_fffffffffffffc40);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    std::
    vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
    ::~vector((vector<miniscript::internal::MaxInt<unsigned_int>,_std::allocator<miniscript::internal::MaxInt<unsigned_int>_>_>
               *)in_stack_fffffffffffffc48);
    break;
  case 0x19:
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  case 0x1a:
    std::vector<CPubKey,_std::allocator<CPubKey>_>::size
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::size
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)
               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
    miniscript::internal::MaxInt<unsigned_int>::MaxInt
              ((MaxInt<unsigned_int> *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
               ,0);
    miniscript::internal::WitnessSize::WitnessSize
              ((WitnessSize *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
               in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x487,
                  "internal::WitnessSize miniscript::Node<CPubKey>::CalcWitnessSize() const [Key = CPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  WVar3.dsat = local_10;
  WVar3.sat = local_18;
  return WVar3;
}

Assistant:

internal::WitnessSize CalcWitnessSize() const {
        const uint32_t sig_size = IsTapscript(m_script_ctx) ? 1 + 65 : 1 + 72;
        const uint32_t pubkey_size = IsTapscript(m_script_ctx) ? 1 + 32 : 1 + 33;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, 0};
            case Fragment::JUST_1:
            case Fragment::OLDER:
            case Fragment::AFTER: return {0, {}};
            case Fragment::PK_K: return {sig_size, 1};
            case Fragment::PK_H: return {sig_size + pubkey_size, 1 + pubkey_size};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {1 + 32, {}};
            case Fragment::ANDOR: {
                const auto sat{(subs[0]->ws.sat + subs[1]->ws.sat) | (subs[0]->ws.dsat + subs[2]->ws.sat)};
                const auto dsat{subs[0]->ws.dsat + subs[2]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::AND_V: return {subs[0]->ws.sat + subs[1]->ws.sat, {}};
            case Fragment::AND_B: return {subs[0]->ws.sat + subs[1]->ws.sat, subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_B: {
                const auto sat{(subs[0]->ws.dsat + subs[1]->ws.sat) | (subs[0]->ws.sat + subs[1]->ws.dsat)};
                const auto dsat{subs[0]->ws.dsat + subs[1]->ws.dsat};
                return {sat, dsat};
            }
            case Fragment::OR_C: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), {}};
            case Fragment::OR_D: return {subs[0]->ws.sat | (subs[0]->ws.dsat + subs[1]->ws.sat), subs[0]->ws.dsat + subs[1]->ws.dsat};
            case Fragment::OR_I: return {(subs[0]->ws.sat + 1 + 1) | (subs[1]->ws.sat + 1), (subs[0]->ws.dsat + 1 + 1) | (subs[1]->ws.dsat + 1)};
            case Fragment::MULTI: return {k * sig_size + 1, k + 1};
            case Fragment::MULTI_A: return {k * sig_size + static_cast<uint32_t>(keys.size()) - k, static_cast<uint32_t>(keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S:
            case Fragment::WRAP_C: return subs[0]->ws;
            case Fragment::WRAP_D: return {1 + 1 + subs[0]->ws.sat, 1};
            case Fragment::WRAP_V: return {subs[0]->ws.sat, {}};
            case Fragment::WRAP_J: return {subs[0]->ws.sat, 1};
            case Fragment::THRESH: {
                auto sats = Vector(internal::MaxInt<uint32_t>(0));
                for (const auto& sub : subs) {
                    auto next_sats = Vector(sats[0] + sub->ws.dsat);
                    for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + sub->ws.dsat) | (sats[j - 1] + sub->ws.sat));
                    next_sats.push_back(sats[sats.size() - 1] + sub->ws.sat);
                    sats = std::move(next_sats);
                }
                assert(k <= sats.size());
                return {sats[k], sats[0]};
            }
        }
        assert(false);
    }